

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.h
# Opt level: O0

void __thiscall bidirectional::Search::replaceIntermediateLabel(Search *this,Label *label)

{
  __shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  shared_ptr<labelling::Label> label_ptr;
  __shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffe0;
  
  std::make_shared<labelling::Label,labelling::Label_const&>
            (label_ptr.super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>::swap
            (in_stack_ffffffffffffffe0,in_RDI);
  std::shared_ptr<labelling::Label>::~shared_ptr((shared_ptr<labelling::Label> *)0x24a312);
  return;
}

Assistant:

void replaceIntermediateLabel(const labelling::Label& label) {
    auto label_ptr = std::make_shared<labelling::Label>(label);
    intermediate_label.swap(label_ptr);
  }